

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
         *this)

{
  double *pdVar1;
  _Base_ptr p_Var2;
  _Rb_tree_node_base *p_Var3;
  ostringstream *poVar4;
  Precision PVar5;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_vkt::shaderexecutor::Void>_>
  *this_00;
  size_t sVar6;
  Statement *pSVar7;
  ShaderExecutor *pSVar8;
  Variable<tcu::Vector<float,_4>_> *pVVar9;
  pointer pcVar10;
  Variable<float> *pVVar11;
  double dVar12;
  TestStatus *pTVar13;
  pointer pVVar14;
  bool bVar15;
  int iVar16;
  undefined8 uVar17;
  long lVar18;
  long lVar19;
  IVal *pIVar20;
  IVal *pIVar21;
  undefined8 *puVar22;
  uint uVar23;
  long lVar24;
  string *psVar25;
  char *pcVar26;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar27;
  long lVar28;
  FloatFormat *pFVar29;
  byte bVar30;
  IVal in2;
  IVal reference1;
  FuncSet funcs;
  IVal in3;
  Environment env;
  FloatFormat highpFmt;
  IVal in0;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_> outputs;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_vkt::shaderexecutor::Void>_>
  inputs;
  void *outputArr [2];
  void *inputArr [4];
  ostringstream oss;
  ResultCollector status;
  _Alloc_hider in_stack_fffffffffffffa78;
  _Alloc_hider _Var31;
  double dStack_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_578;
  IVal *local_560;
  IVal local_551;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_550;
  long local_548;
  undefined1 local_540 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_530;
  _Rb_tree_node_base *local_520;
  double local_518;
  size_t local_4e0;
  FloatFormat *local_4d8;
  string local_4d0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_4b0;
  TestStatus *local_480;
  long local_478;
  long local_470;
  FloatFormat local_468;
  undefined8 uStack_440;
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  double local_418;
  Precision local_410;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  *local_408;
  undefined4 local_400;
  ios_base local_3c8 [8];
  ios_base local_3c0 [264];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
  local_2b8;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_vkt::shaderexecutor::Void>_>
  local_288;
  pointer local_228;
  pointer local_220;
  pointer local_218;
  pointer local_210;
  pointer local_208;
  pointer local_200;
  IVal local_1f8;
  ios_base local_188 [264];
  ResultCollector local_80;
  
  bVar30 = 0;
  this_00 = this->m_samplings;
  pFVar29 = &(this->m_caseCtx).floatFormat;
  PVar5 = (this->m_caseCtx).precision;
  sVar6 = (this->m_caseCtx).numRandoms;
  local_480 = __return_storage_ptr__;
  iVar16 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  local_4d8 = pFVar29;
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,tcu::Vector<float,4>,float,vkt::shaderexecutor::Void>>
            (&local_288,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<float,_4>,_float,_vkt::shaderexecutor::Void>_>
              *)pFVar29,(FloatFormat *)(ulong)PVar5,(Precision)sVar6,(ulong)(iVar16 + 0xdeadbeef),
             (deUint32)SUB84(in_stack_fffffffffffffa78._M_p,0));
  pVVar14 = local_288.in0.
            super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_4e0 = (long)local_288.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_288.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>::Outputs
            (&local_2b8,local_4e0);
  local_468.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  local_468.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  local_468.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  local_468.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  local_468.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  local_468.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  local_468.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  local_468.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  local_468._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  local_4b0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4b0._M_impl.super__Rb_tree_header._M_header;
  local_4b0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4b0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4b0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4b0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4b0._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&local_80);
  local_550 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_218 = local_288.in0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_210 = local_288.in1.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_208 = local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  local_200 = local_288.in3.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_228 = local_2b8.out0.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
  local_220 = local_2b8.out1.
              super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
              ._M_impl.super__Vector_impl_data._M_start;
  poVar4 = (ostringstream *)(local_438 + 8);
  local_438._0_8_ = local_550;
  std::__cxx11::ostringstream::ostringstream(poVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"Statement: ",0xb);
  std::ostream::_M_insert<bool>(SUB81(poVar4,0));
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar4);
  std::ios_base::~ios_base(local_3c0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
  p_Var3 = (_Rb_tree_node_base *)(local_540 + 8);
  local_540._8_4_ = _S_red;
  local_530._M_allocated_capacity = 0;
  local_518 = 0.0;
  pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  local_530._8_8_ = p_Var3;
  local_520 = p_Var3;
  (*pSVar7->_vptr_Statement[4])(pSVar7,local_540);
  if ((_Rb_tree_node_base *)local_530._8_8_ != p_Var3) {
    uVar17 = local_530._8_8_;
    do {
      (**(code **)(**(long **)(uVar17 + 0x20) + 0x30))(*(long **)(uVar17 + 0x20),&local_1f8);
      uVar17 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar17);
    } while ((_Rb_tree_node_base *)uVar17 != p_Var3);
  }
  if (local_518 != 0.0) {
    poVar4 = (ostringstream *)(local_438 + 8);
    local_438._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar4,in_stack_fffffffffffffa78._M_p,(long)dStack_580);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)in_stack_fffffffffffffa78._M_p != &local_578) {
      operator_delete(in_stack_fffffffffffffa78._M_p,local_578._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_3c0);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
               *)local_540);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
  std::ios_base::~ios_base(local_188);
  pSVar8 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  (*pSVar8->_vptr_ShaderExecutor[2])(pSVar8,local_4e0,&local_218,&local_228,0);
  pFVar29 = local_4d8;
  lVar18 = 0x10;
  do {
    *(undefined1 *)((long)&local_468.m_maxValue + lVar18) = 0;
    *(undefined8 *)((long)&uStack_440 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_438 + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x70);
  lVar18 = 0x10;
  do {
    *(undefined1 *)((long)&local_468.m_maxValue + lVar18) = 0;
    *(undefined8 *)((long)&uStack_440 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_438 + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x70);
  lVar18 = 0x10;
  do {
    *(undefined1 *)((long)&local_208 + lVar18) = 0;
    *(undefined8 *)((long)&local_200 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x70);
  lVar18 = 0x10;
  do {
    *(undefined1 *)((long)&local_208 + lVar18) = 0;
    *(undefined8 *)((long)&local_200 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x70);
  local_578._M_allocated_capacity = 0xfff0000000000000;
  lVar18 = 0x10;
  do {
    *(undefined1 *)((long)&local_550 + lVar18) = 0;
    *(undefined8 *)((long)&local_548 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_540 + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x70);
  lVar18 = 0x10;
  do {
    *(undefined1 *)((long)&local_550 + lVar18) = 0;
    *(undefined8 *)((long)&local_548 + lVar18) = 0x7ff0000000000000;
    *(undefined8 *)(local_540 + lVar18) = 0xfff0000000000000;
    lVar18 = lVar18 + 0x18;
  } while (lVar18 != 0x70);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_4b0,
             (this->m_variables).in0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_438);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_4b0,
             (this->m_variables).in1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             &local_1f8);
  Environment::bind<float>
            ((Environment *)&local_4b0,
             (this->m_variables).in2.super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
             m_ptr,(IVal *)&stack0xfffffffffffffa78);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4b0,
             (this->m_variables).in3.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             (IVal *)&local_4d0);
  Environment::bind<tcu::Vector<float,4>>
            ((Environment *)&local_4b0,
             (this->m_variables).out0.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr,
             (IVal *)local_540);
  Environment::bind<vkt::shaderexecutor::Void>
            ((Environment *)&local_4b0,
             (this->m_variables).out1.
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr,
             &local_551);
  if (local_288.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_finish == pVVar14) {
    local_560 = (IVal *)0x0;
  }
  else {
    local_478 = local_4e0 + (local_4e0 == 0);
    local_548 = 0;
    local_560 = (IVal *)0x0;
    do {
      lVar18 = local_548;
      lVar19 = 0x10;
      do {
        *(undefined1 *)((long)&local_208 + lVar19) = 0;
        *(undefined8 *)((long)&local_200 + lVar19) = 0x7ff0000000000000;
        *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar19) = 0xfff0000000000000;
        lVar19 = lVar19 + 0x18;
      } while (lVar19 != 0x70);
      lVar19 = 0x10;
      do {
        *(undefined1 *)((long)&local_208 + lVar19) = 0;
        *(undefined8 *)((long)&local_200 + lVar19) = 0x7ff0000000000000;
        *(undefined8 *)(&local_1f8.m_data[0].m_hasNaN + lVar19) = 0xfff0000000000000;
        lVar19 = lVar19 + 0x18;
      } while (lVar19 != 0x70);
      lVar28 = local_548 * 0x10;
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_540,pFVar29,(Vector<float,_4> *)&stack0xfffffffffffffa78);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_438,pFVar29,(IVal *)local_540);
      pIVar20 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_4b0,
                           (this->m_variables).in0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar22 = (undefined8 *)local_438;
      for (lVar19 = 0xc; lVar19 != 0; lVar19 = lVar19 + -1) {
        *(undefined8 *)pIVar20->m_data = *puVar22;
        puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
        pIVar20 = (IVal *)((long)pIVar20 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      _Var31._M_p = *(pointer *)
                     local_288.in1.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar18].m_data;
      lVar19 = *(long *)(local_288.in1.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[lVar18].m_data + 2);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doRound
                ((IVal *)local_540,pFVar29,(Vector<float,_4> *)&stack0xfffffffffffffa78);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_438,pFVar29,(IVal *)local_540);
      pIVar20 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_4b0,
                           (this->m_variables).in1.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      puVar22 = (undefined8 *)local_438;
      for (lVar24 = 0xc; lVar24 != 0; lVar24 = lVar24 + -1) {
        *(undefined8 *)pIVar20->m_data = *puVar22;
        puVar22 = puVar22 + (ulong)bVar30 * -2 + 1;
        pIVar20 = (IVal *)((long)pIVar20 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      dVar12 = (double)local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[local_548];
      bVar15 = NAN(local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start[local_548]);
      local_438[0] = bVar15;
      local_438._8_8_ = INFINITY;
      if (!bVar15) {
        local_438._8_8_ = dVar12;
      }
      local_428._M_allocated_capacity = (size_type)-INFINITY;
      if (!bVar15) {
        local_428._M_allocated_capacity = (size_type)dVar12;
      }
      tcu::FloatFormat::roundOut
                ((Interval *)&stack0xfffffffffffffa78,pFVar29,(Interval *)local_438,false);
      tcu::FloatFormat::convert((Interval *)local_540,pFVar29,(Interval *)&stack0xfffffffffffffa78);
      pIVar21 = Environment::lookup<float>
                          ((Environment *)&local_4b0,
                           (this->m_variables).in2.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr);
      pIVar21->m_hi = (double)local_530._M_allocated_capacity;
      *(undefined8 *)pIVar21 = local_540._0_8_;
      pIVar21->m_lo = (double)CONCAT44(local_540._12_4_,local_540._8_4_);
      Environment::lookup<vkt::shaderexecutor::Void>
                ((Environment *)&local_4b0,
                 (this->m_variables).in3.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                 m_ptr);
      local_410 = (this->m_caseCtx).precision;
      local_418 = pFVar29->m_maxValue;
      local_438._0_8_ = *(undefined8 *)pFVar29;
      local_438._8_8_ = *(undefined8 *)&pFVar29->m_fractionBits;
      local_428._M_allocated_capacity = *(undefined8 *)&pFVar29->m_hasInf;
      local_428._8_1_ = pFVar29->m_exactPrecision;
      local_428._9_3_ = *(undefined3 *)&pFVar29->field_0x19;
      local_428._12_4_ = *(undefined4 *)&pFVar29->field_0x1c;
      local_400 = 0;
      pSVar7 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
      local_408 = &local_4b0;
      (*pSVar7->_vptr_Statement[3])(pSVar7,(string *)local_438);
      pIVar20 = Environment::lookup<tcu::Vector<float,4>>
                          ((Environment *)&local_4b0,
                           (this->m_variables).out0.
                           super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
                ((IVal *)local_438,&local_468,pIVar20);
      psVar25 = (string *)local_438;
      pIVar20 = &local_1f8;
      for (lVar24 = 0xc; lVar24 != 0; lVar24 = lVar24 + -1) {
        *(pointer *)pIVar20->m_data = (psVar25->_M_dataplus)._M_p;
        psVar25 = (string *)((long)psVar25 + (ulong)bVar30 * -0x10 + 8);
        pIVar20 = (IVal *)((long)pIVar20 + ((ulong)bVar30 * -2 + 1) * 8);
      }
      local_470 = lVar28;
      bVar15 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                         (&local_1f8,
                          local_2b8.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar18);
      local_438._0_8_ = &local_428;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Shader output 0 is outside acceptable range","");
      bVar15 = tcu::ResultCollector::check(&local_80,bVar15,(string *)local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ != &local_428) {
        operator_delete((void *)local_438._0_8_,(ulong)(local_428._M_allocated_capacity + 1));
      }
      uVar23 = (int)local_560 + ((byte)~bVar15 & 1);
      pIVar20 = (IVal *)(ulong)uVar23;
      local_560 = pIVar20;
      if ((int)uVar23 < 0x65 && !bVar15) {
        local_438._0_8_ = local_550;
        poVar4 = (ostringstream *)(local_438 + 8);
        std::__cxx11::ostringstream::ostringstream(poVar4);
        pcVar26 = "Failed";
        if (bVar15) {
          pcVar26 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,pcVar26,6);
        lVar18 = local_470;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar9 = (this->m_variables).in0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_540._0_8_ = &local_530;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)&stack0xfffffffffffffa78,(shaderexecutor *)&local_468,
                   (FloatFormat *)
                   ((long)(local_288.in0.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18),
                   (Vector<float,_4> *)pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,_Var31._M_p,lVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var31._M_p != &local_578) {
          operator_delete(_Var31._M_p,local_578._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._0_8_ != &local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar9 = (this->m_variables).in1.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_540._0_8_ = &local_530;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)&stack0xfffffffffffffa78,(shaderexecutor *)&local_468,
                   (FloatFormat *)
                   ((long)(local_288.in1.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18),
                   (Vector<float,_4> *)pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,_Var31._M_p,lVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var31._M_p != &local_578) {
          operator_delete(_Var31._M_p,local_578._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._0_8_ != &local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar11 = (this->m_variables).in2.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr;
        pcVar10 = (pVVar11->m_name)._M_dataplus._M_p;
        local_540._0_8_ = &local_530;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar10,pcVar10 + (pVVar11->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<float>
                  ((string *)&stack0xfffffffffffffa78,&local_468,
                   local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start + local_548);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,_Var31._M_p,lVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var31._M_p != &local_578) {
          operator_delete(_Var31._M_p,local_578._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._0_8_ != &local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._M_allocated_capacity + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\t",1);
        pVVar9 = (this->m_variables).out0.
                 super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.m_ptr
        ;
        pcVar10 = (pVVar9->m_name)._M_dataplus._M_p;
        local_540._0_8_ = &local_530;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_540,pcVar10,pcVar10 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,(char *)local_540._0_8_,
                   CONCAT44(local_540._12_4_,local_540._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," = ",3);
        valueToString<tcu::Vector<float,4>>
                  ((string *)&stack0xfffffffffffffa78,(shaderexecutor *)&local_468,
                   (FloatFormat *)
                   ((long)(local_2b8.out0.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar18),
                   (Vector<float,_4> *)pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,_Var31._M_p,lVar19);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,"\tExpected range: ",0x11);
        intervalToString<tcu::Vector<float,4>>
                  (&local_4d0,(shaderexecutor *)&local_468,(FloatFormat *)&local_1f8,pIVar20);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar4,local_4d0._M_dataplus._M_p,local_4d0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
          operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var31._M_p != &local_578) {
          operator_delete(_Var31._M_p,local_578._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_540._0_8_ != &local_530) {
          operator_delete((void *)local_540._0_8_,(ulong)(local_530._M_allocated_capacity + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar4);
        std::ios_base::~ios_base(local_3c0);
      }
      local_548 = local_548 + 1;
      pFVar29 = local_4d8;
    } while (local_548 != local_478);
  }
  pTVar13 = local_480;
  if (100 < (int)local_560) {
    poVar4 = (ostringstream *)(local_438 + 8);
    local_438._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"(Skipped ",9);
    std::ostream::operator<<(poVar4,(int)local_560 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar4);
    std::ios_base::~ios_base(local_3c0);
  }
  if ((int)local_560 == 0) {
    poVar4 = (ostringstream *)(local_438 + 8);
    local_438._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    poVar4 = (ostringstream *)(local_438 + 8);
    local_438._0_8_ = local_550;
    std::__cxx11::ostringstream::ostringstream(poVar4);
    std::ostream::operator<<(poVar4,(int)local_560);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar4," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_438,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_438 + 8));
  std::ios_base::~ios_base(local_3c0);
  if ((int)local_560 == 0) {
    local_438._0_8_ = &local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Pass","");
    pTVar13->m_code = QP_TEST_RESULT_PASS;
    (pTVar13->m_description)._M_dataplus._M_p = (pointer)&(pTVar13->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar13->m_description,local_438._0_8_,
               (char *)(local_438._0_8_ + local_438._8_8_));
    uVar17 = local_428._M_allocated_capacity;
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ == &local_428) goto LAB_00914e2a;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_438);
    std::ostream::operator<<(local_438,(int)local_560);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_438);
    std::ios_base::~ios_base(local_3c8);
    local_438._0_8_ = &local_428;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_438," test failed. Check log for the details","");
    p_Var2 = (_Base_ptr)(local_438._8_8_ + CONCAT44(local_540._12_4_,local_540._8_4_));
    uVar17 = (_Base_ptr)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._0_8_ != &local_530) {
      uVar17 = local_530._M_allocated_capacity;
    }
    if ((ulong)uVar17 < p_Var2) {
      uVar17 = (_Base_ptr)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._0_8_ != &local_428) {
        uVar17 = local_428._M_allocated_capacity;
      }
      if ((ulong)uVar17 < p_Var2) goto LAB_00914cbf;
      puVar22 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_438,0,(char *)0x0,local_540._0_8_);
    }
    else {
LAB_00914cbf:
      puVar22 = (undefined8 *)std::__cxx11::string::_M_append(local_540,local_438._0_8_);
    }
    local_1f8.m_data[0]._0_8_ = &local_1f8.m_data[0].m_hi;
    pdVar1 = (double *)(puVar22 + 2);
    if ((double *)*puVar22 == pdVar1) {
      local_1f8.m_data[0].m_hi = *pdVar1;
      local_1f8.m_data[1]._0_4_ = *(undefined4 *)(puVar22 + 3);
      local_1f8.m_data[1]._4_4_ = *(undefined4 *)((long)puVar22 + 0x1c);
    }
    else {
      local_1f8.m_data[0].m_hi = *pdVar1;
      local_1f8.m_data[0]._0_8_ = (double *)*puVar22;
    }
    local_1f8.m_data[0].m_lo = (double)puVar22[1];
    *puVar22 = pdVar1;
    puVar22[1] = 0;
    *(undefined1 *)pdVar1 = 0;
    pTVar13->m_code = QP_TEST_RESULT_FAIL;
    (pTVar13->m_description)._M_dataplus._M_p = (pointer)&(pTVar13->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar13->m_description,local_1f8.m_data[0]._0_8_,
               (undefined1 *)((long)local_1f8.m_data[0].m_lo + local_1f8.m_data[0]._0_8_));
    if ((double *)local_1f8.m_data[0]._0_8_ != &local_1f8.m_data[0].m_hi) {
      operator_delete((void *)local_1f8.m_data[0]._0_8_,(long)local_1f8.m_data[0].m_hi + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._0_8_ != &local_428) {
      operator_delete((void *)local_438._0_8_,(ulong)(local_428._M_allocated_capacity + 1));
    }
    uVar17 = local_530._M_allocated_capacity;
    paVar27 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_540._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_540._0_8_ == &local_530) goto LAB_00914e2a;
  }
  operator_delete(paVar27,(ulong)((long)&((_Base_ptr)uVar17)->_M_color + 1));
LAB_00914e2a:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_message._M_dataplus._M_p != &local_80.m_message.field_2) {
    operator_delete(local_80.m_message._M_dataplus._M_p,
                    local_80.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.m_prefix._M_dataplus._M_p != &local_80.m_prefix.field_2) {
    operator_delete(local_80.m_prefix._M_dataplus._M_p,
                    local_80.m_prefix.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_4b0);
  if (local_2b8.out1.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.out1.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.out1.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_2b8.out0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2b8.out0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2b8.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2b8.out0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.in3.
      super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.in3.
                    super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.in3.
                          super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.in2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_288.in1.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.in1.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.in1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.in1.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_288.in0.
      super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_288.in0.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_288.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_288.in0.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return pTVar13;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}